

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subgetopt.c
# Opt level: O3

int subgetopt(int argc,char **argv,char *opts)

{
  int iVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  char cVar7;
  int iVar8;
  long lVar9;
  char cVar10;
  
  subgetoptarg = (char *)0x0;
  if ((argv == (char **)0x0) || (argc <= subgetoptind)) {
    return subgetoptdone;
  }
  lVar4 = (long)subgetoptind;
  pcVar6 = argv[lVar4];
  if (pcVar6 == (char *)0x0) {
    subgetoptarg = (char *)0x0;
    return subgetoptdone;
  }
  lVar9 = (long)subgetoptpos;
  if (lVar9 == 0) {
LAB_00102e38:
    if (*pcVar6 != '-') {
      subgetoptarg = (char *)0x0;
      return subgetoptdone;
    }
    cVar7 = pcVar6[1];
    if (cVar7 != '\0') {
      if (cVar7 != '-') {
        iVar8 = 2;
        goto LAB_00102dca;
      }
      subgetoptind = subgetoptind + 1;
    }
    subgetoptpos = 0;
    iVar8 = subgetoptdone;
  }
  else {
    if (pcVar6[lVar9] == '\0') {
      subgetoptind = subgetoptind + 1;
      subgetoptpos = 0;
      if (argc <= subgetoptind) {
        subgetoptpos = 0;
        subgetoptarg = (char *)0x0;
        return subgetoptdone;
      }
      pcVar6 = argv[lVar4 + 1];
      if (pcVar6 == (char *)0x0) {
        subgetoptpos = 0;
        subgetoptarg = (char *)0x0;
        return subgetoptdone;
      }
      goto LAB_00102e38;
    }
    cVar7 = pcVar6[lVar9];
    iVar8 = subgetoptpos + 1;
LAB_00102dca:
    iVar3 = (int)cVar7;
    cVar10 = *opts;
    while (iVar1 = subgetoptind, subgetoptpos = iVar8, cVar10 != '\0') {
      cVar2 = opts[1];
      if (cVar7 == cVar10) {
        if (cVar2 != ':') {
          subgetoptarg = (char *)0x0;
          return iVar3;
        }
        iVar1 = subgetoptind + 1;
        subgetoptpos = 0;
        if (pcVar6[iVar8] != '\0') {
          subgetoptind = iVar1;
          subgetoptpos = 0;
          subgetoptarg = pcVar6 + iVar8;
          return iVar3;
        }
        subgetoptarg = argv[iVar1];
        if (iVar1 < argc && subgetoptarg != (char *)0x0) {
          subgetoptind = subgetoptind + 2;
          subgetoptpos = 0;
          return iVar3;
        }
        break;
      }
      if (cVar2 == ':') {
        pcVar5 = opts + 2;
      }
      else {
        pcVar5 = opts + 1;
      }
      cVar10 = opts[(ulong)(cVar2 == ':') + 1];
      opts = pcVar5;
    }
    subgetoptind = iVar1;
    iVar8 = 0x3f;
    subgetoptproblem = iVar3;
  }
  return iVar8;
}

Assistant:

int sgopt(int argc,const char *const *argv,const char *opts)
{
  int c;
  const char *s;

  optarg = 0;
  if (!argv || (optind >= argc) || !argv[optind]) return optdone;
  if (optpos && !argv[optind][optpos]) {
    ++optind;
    optpos = 0;
    if ((optind >= argc) || !argv[optind]) return optdone;
  }
  if (!optpos) {
    if (argv[optind][0] != '-') return optdone;
    ++optpos;
    c = argv[optind][1];
    if ((c == '-') || (c == 0)) {
      if (c) ++optind;
      optpos = 0;
      return optdone;
    }
    /* otherwise c is reassigned below */
  }
  c = argv[optind][optpos];
  ++optpos;
  s = opts;
  while (*s) {
    if (c == *s) {
      if (s[1] == ':') {
        optarg = argv[optind] + optpos;
        ++optind;
        optpos = 0;
        if (!*optarg) {
          optarg = argv[optind];
          if ((optind >= argc) || !optarg) { /* argument past end */
            optproblem = c;
            return '?';
          }
          ++optind;
        }
      }
      return c;
    }
    ++s;
    if (*s == ':') ++s;
  }
  optproblem = c;
  return '?';
}